

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O3

void __thiscall
CMU462::Edge::getAxes(Edge *this,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  pointer pVVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  Vector3D local_38;
  
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize(axes,3);
  p_Var1 = (this->_halfedge)._M_node;
  p_Var2 = p_Var1[1]._M_prev;
  p_Var3 = p_Var1[2]._M_prev;
  p_Var4 = p_Var2[2]._M_prev;
  dVar12 = (double)p_Var4[2]._M_next - (double)p_Var3[2]._M_next;
  dVar7 = (double)p_Var4[2]._M_prev - (double)p_Var3[2]._M_prev;
  dVar9 = (double)p_Var4[1]._M_prev - (double)p_Var3[1]._M_prev;
  dVar10 = 1.0 / SQRT(dVar7 * dVar7 + dVar9 * dVar9 + dVar12 * dVar12);
  dVar12 = dVar12 * dVar10;
  dVar7 = dVar10 * dVar7;
  dVar10 = dVar10 * dVar9;
  pVVar5 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar5->x = dVar10;
  pVVar5->y = dVar12;
  pVVar5->z = dVar7;
  p_Var2 = p_Var2[3]._M_prev;
  dVar9 = 0.0;
  dVar11 = 0.0;
  dVar14 = 0.0;
  if (*(char *)&p_Var1[3]._M_prev[0xc]._M_next == '\0') {
    Face::normal(&local_38,(Face *)(p_Var1[3]._M_prev + 1));
    dVar9 = local_38.x;
    dVar11 = local_38.y;
    dVar14 = local_38.z;
  }
  dVar13 = 0.0;
  dVar6 = 0.0;
  dVar8 = 0.0;
  if (*(char *)&p_Var2[0xc]._M_next == '\0') {
    Face::normal(&local_38,(Face *)(p_Var2 + 1));
    dVar13 = local_38.x;
    dVar6 = local_38.y;
    dVar8 = local_38.z;
  }
  dVar14 = dVar14 + dVar8;
  dVar9 = dVar9 + dVar13;
  dVar11 = dVar11 + dVar6;
  dVar13 = 1.0 / SQRT(dVar14 * dVar14 + dVar9 * dVar9 + dVar11 * dVar11);
  dVar14 = dVar14 * dVar13;
  dVar9 = dVar13 * dVar9;
  dVar13 = dVar13 * dVar11;
  pVVar5[2].x = dVar9;
  pVVar5[2].y = dVar13;
  pVVar5[2].z = dVar14;
  pVVar5[1].x = dVar13 * dVar7 - dVar12 * dVar14;
  pVVar5[1].y = dVar14 * dVar10 - dVar7 * dVar9;
  pVVar5[1].z = dVar9 * dVar12 - dVar10 * dVar13;
  return;
}

Assistant:

void Edge::getAxes( vector<Vector3D>& axes ) const
  {
    axes.resize(3);

    // Set the X direction to the edge direction, with
    // orientation determined by the first halfedge.
    Vector3D p0 = halfedge()->vertex()->position;
    Vector3D p1 = halfedge()->twin()->vertex()->position;
    axes[0] = ( p1 - p0 ).unit();

    // For the Z direction, use the average of the two
    // incident triangles---or if we have a boundary edge,
    // just use the normal of the single interior face.
    Vector3D N0( 0., 0., 0. );
    Vector3D N1( 0., 0., 0. );
    FaceCIter f0 = halfedge()->face();
    FaceCIter f1 = halfedge()->twin()->face();
    if( !f0->isBoundary() ) N0 = f0->normal();
    if( !f1->isBoundary() ) N1 = f1->normal();
    axes[2] = ( N0 + N1 ).unit();

    // Choose the Y direction so that X x Y = Z
    axes[1] = cross( axes[2], axes[0] );
  }